

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O3

int add_hd_table_incremental
              (nghttp2_hd_context *context,nghttp2_hd_nv *nv,nghttp2_hd_map *map,uint32_t hash)

{
  uint32_t uVar1;
  nghttp2_mem *mem;
  size_t sVar2;
  uint uVar3;
  int iVar4;
  nghttp2_hd_entry *pnVar5;
  ulong uVar6;
  nghttp2_hd_entry **ppnVar7;
  nghttp2_hd_entry *pnVar8;
  nghttp2_hd_entry *pnVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  size_t sVar13;
  nghttp2_rcbuf *rcbuf;
  
  mem = context->mem;
  sVar13 = context->hd_table_bufsize_max;
  uVar12 = nv->name->len + nv->value->len + 0x20;
  sVar2 = context->hd_table_bufsize;
  while ((sVar13 < sVar2 + uVar12 && (sVar2 = (context->hd_table).len, sVar2 != 0))) {
    pnVar5 = hd_ringbuf_get(&context->hd_table,sVar2 - 1);
    rcbuf = (pnVar5->nv).value;
    sVar13 = (context->hd_table).len;
    context->hd_table_bufsize =
         (context->hd_table_bufsize - (((pnVar5->nv).name)->len + rcbuf->len)) - 0x20;
    if (sVar13 == 0) {
      __assert_fail("ringbuf->len > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_hd.c"
                    ,0x29e,"void hd_ringbuf_pop_back(nghttp2_hd_ringbuf *)");
    }
    (context->hd_table).len = sVar13 - 1;
    if (map != (nghttp2_hd_map *)0x0) {
      uVar3 = pnVar5->hash & 0x7f;
      pnVar8 = map->table[uVar3];
      if (pnVar8 != (nghttp2_hd_entry *)0x0) {
        if (pnVar8 == pnVar5) {
          ppnVar7 = map->table + uVar3;
        }
        else {
          do {
            pnVar9 = pnVar8;
            pnVar8 = pnVar9->next;
            if (pnVar8 == (nghttp2_hd_entry *)0x0) goto LAB_005e3b69;
          } while (pnVar8 != pnVar5);
          ppnVar7 = &pnVar9->next;
        }
        *ppnVar7 = pnVar5->next;
        pnVar5->next = (nghttp2_hd_entry *)0x0;
        rcbuf = (pnVar5->nv).value;
      }
    }
LAB_005e3b69:
    nghttp2_rcbuf_decref(rcbuf);
    nghttp2_rcbuf_decref((pnVar5->nv).name);
    nghttp2_mem_free(mem,pnVar5);
    sVar2 = context->hd_table_bufsize;
    sVar13 = context->hd_table_bufsize_max;
  }
  if (sVar13 < uVar12) {
    return 0;
  }
  pnVar5 = (nghttp2_hd_entry *)nghttp2_mem_malloc(mem,0x50);
  if (pnVar5 == (nghttp2_hd_entry *)0x0) {
LAB_005e3cd6:
    iVar4 = -0x385;
  }
  else {
    nghttp2_hd_entry_init(pnVar5,nv);
    uVar11 = (context->hd_table).mask;
    uVar6 = (context->hd_table).len + 1;
    if (uVar11 + 1 < uVar6) {
      uVar10 = 1;
      do {
        uVar11 = uVar10;
        uVar10 = uVar11 * 2;
      } while (uVar11 < uVar6);
      ppnVar7 = (nghttp2_hd_entry **)nghttp2_mem_malloc(mem,uVar11 * 8);
      if (ppnVar7 == (nghttp2_hd_entry **)0x0) {
        nghttp2_rcbuf_decref((pnVar5->nv).value);
        nghttp2_rcbuf_decref((pnVar5->nv).name);
        nghttp2_mem_free(mem,pnVar5);
        goto LAB_005e3cd6;
      }
      if ((context->hd_table).len != 0) {
        sVar13 = 0;
        do {
          pnVar8 = hd_ringbuf_get(&context->hd_table,sVar13);
          ppnVar7[sVar13] = pnVar8;
          sVar13 = sVar13 + 1;
        } while (sVar13 < (context->hd_table).len);
      }
      nghttp2_mem_free(mem,(context->hd_table).buffer);
      (context->hd_table).buffer = ppnVar7;
      uVar11 = uVar11 - 1;
      (context->hd_table).mask = uVar11;
      uVar6 = (context->hd_table).len + 1;
      uVar10 = 0xffffffffffffffff;
    }
    else {
      ppnVar7 = (context->hd_table).buffer;
      uVar10 = (context->hd_table).first - 1;
    }
    (context->hd_table).first = uVar10;
    ppnVar7[uVar11 & uVar10] = pnVar5;
    (context->hd_table).len = uVar6;
    uVar1 = context->next_seq;
    context->next_seq = uVar1 + 1;
    pnVar5->seq = uVar1;
    pnVar5->hash = hash;
    iVar4 = 0;
    if (map != (nghttp2_hd_map *)0x0) {
      if (map->table[hash & 0x7f] != (nghttp2_hd_entry *)0x0) {
        pnVar5->next = map->table[hash & 0x7f];
      }
      map->table[hash & 0x7f] = pnVar5;
    }
    context->hd_table_bufsize = context->hd_table_bufsize + uVar12;
  }
  return iVar4;
}

Assistant:

static int add_hd_table_incremental(nghttp2_hd_context *context,
                                    nghttp2_hd_nv *nv, nghttp2_hd_map *map,
                                    uint32_t hash) {
  int rv;
  nghttp2_hd_entry *new_ent;
  size_t room;
  nghttp2_mem *mem;

  mem = context->mem;
  room = entry_room(nv->name->len, nv->value->len);

  while (context->hd_table_bufsize + room > context->hd_table_bufsize_max &&
         context->hd_table.len > 0) {

    size_t idx = context->hd_table.len - 1;
    nghttp2_hd_entry *ent = hd_ringbuf_get(&context->hd_table, idx);

    context->hd_table_bufsize -=
        entry_room(ent->nv.name->len, ent->nv.value->len);

    DEBUGF("hpack: remove item from header table: %s: %s\n",
           (char *)ent->nv.name->base, (char *)ent->nv.value->base);

    hd_ringbuf_pop_back(&context->hd_table);
    if (map) {
      hd_map_remove(map, ent);
    }

    nghttp2_hd_entry_free(ent);
    nghttp2_mem_free(mem, ent);
  }

  if (room > context->hd_table_bufsize_max) {
    /* The entry taking more than NGHTTP2_HD_MAX_BUFFER_SIZE is
       immediately evicted.  So we don't allocate memory for it. */
    return 0;
  }

  new_ent = nghttp2_mem_malloc(mem, sizeof(nghttp2_hd_entry));
  if (new_ent == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  nghttp2_hd_entry_init(new_ent, nv);

  rv = hd_ringbuf_push_front(&context->hd_table, new_ent, mem);

  if (rv != 0) {
    nghttp2_hd_entry_free(new_ent);
    nghttp2_mem_free(mem, new_ent);

    return rv;
  }

  new_ent->seq = context->next_seq++;
  new_ent->hash = hash;

  if (map) {
    hd_map_insert(map, new_ent);
  }

  context->hd_table_bufsize += room;

  return 0;
}